

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void array_get_bang(t_array_rangeop *x)

{
  _outlet *x_00;
  word wVar1;
  int iVar2;
  word wVar3;
  t_atom tStack_48;
  word local_38;
  t_atom *outv;
  int i;
  int arrayonset;
  int nitem;
  int stride;
  char *firstitem;
  char *itemp;
  t_array_rangeop *x_local;
  
  wVar3.w_symbol = (t_symbol *)&tStack_48;
  itemp = (char *)x;
  iVar2 = array_rangeop_getrange(x,(char **)&nitem,&i,&arrayonset,(int *)((long)&outv + 4));
  if (iVar2 != 0) {
    if (i < 100) {
      wVar3.w_binbuf = (_binbuf *)(&tStack_48 + -(long)i);
      tStack_48.a_w.w_binbuf = wVar3.w_binbuf;
    }
    else {
      tStack_48.a_w.w_symbol = (t_symbol *)getbytes((long)i << 4);
    }
    iVar2 = i;
    wVar1 = tStack_48.a_w;
    local_38.w_symbol = tStack_48.a_w.w_symbol;
    firstitem = _nitem;
    for (outv._0_4_ = 0; (int)outv < i; outv._0_4_ = (int)outv + 1) {
      ((t_atom *)(tStack_48.a_w.w_binbuf + (int)outv))->a_type = A_FLOAT;
      (((t_atom *)(tStack_48.a_w.w_binbuf + (int)outv))->a_w).w_index = *(int *)firstitem;
      firstitem = firstitem + arrayonset;
    }
    x_00 = *(_outlet **)(itemp + 0x18);
    (((t_atom *)(wVar3.w_binbuf + -1))->a_w).w_symbol = (t_symbol *)0x1b75a1;
    outlet_list(x_00,(t_symbol *)0x0,iVar2,(t_atom *)wVar1.w_symbol);
    wVar1 = local_38;
    tStack_48._7_1_ = 1;
    if (99 < i) {
      (((t_atom *)(wVar3.w_binbuf + -1))->a_w).w_symbol = (t_symbol *)0x1b75bd;
      freebytes(wVar1.w_symbol,(long)i << 4);
    }
  }
  return;
}

Assistant:

static void array_get_bang(t_array_rangeop *x)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    t_atom *outv;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    ATOMS_ALLOCA(outv, nitem);
    for (i = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        SETFLOAT(&outv[i],  *(t_float *)itemp);
    outlet_list(x->x_outlet, 0, nitem, outv);
    ATOMS_FREEA(outv, nitem);
}